

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::RegisterTests
          (ParameterizedTestSuiteInfo<BloatyOutputTest> *this)

{
  bool bVar1;
  undefined1 condition;
  undefined1 uVar2;
  pointer pIVar3;
  ulong uVar4;
  element_type *peVar5;
  BloatyTestEntry *factory;
  ostream *poVar6;
  size_type sVar7;
  void *this_00;
  char *filename;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  bool in_stack_00000057;
  CodeLocation *in_stack_00000058;
  string *in_stack_00000060;
  string param_name;
  Message test_name_stream;
  iterator param_it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  string test_suite_name;
  int line;
  char *file;
  ParamNameGeneratorFunc *name_func;
  ParamGenerator<BloatyTestEntry> generator;
  string *instantiation_name;
  iterator gen_it;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo> test_info;
  iterator test_it;
  bool generated_instantiations;
  CodeLocation *in_stack_fffffffffffffbe8;
  BloatyTestEntry *in_stack_fffffffffffffbf0;
  BloatyTestEntry *in_stack_fffffffffffffbf8;
  TestParamInfo<BloatyTestEntry> *in_stack_fffffffffffffc00;
  value_type *in_stack_fffffffffffffc08;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc10;
  BloatyTestEntry *in_stack_fffffffffffffc18;
  BloatyTestEntry *in_stack_fffffffffffffc20;
  CodeLocation *in_stack_fffffffffffffc38;
  int line_num;
  BloatyTestEntry *in_stack_fffffffffffffc58;
  int line_00;
  char *in_stack_fffffffffffffc60;
  Message *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  void *in_stack_fffffffffffffcc8;
  CodeLocation *in_stack_fffffffffffffcd0;
  ostream *in_stack_fffffffffffffcd8;
  ostream *in_stack_fffffffffffffce0;
  ostream *in_stack_fffffffffffffce8;
  ostream *in_stack_fffffffffffffcf0;
  undefined6 in_stack_fffffffffffffd00;
  ParamNameGeneratorFunc *tear_down_tc;
  undefined1 local_2a8 [64];
  BloatyTestEntry *in_stack_fffffffffffffd98;
  string local_208 [32];
  string local_1e8 [32];
  _Base_ptr local_1c8;
  undefined1 local_1c0;
  GTestLog local_1b8;
  GTestLog local_1b4;
  TestParamInfo<BloatyTestEntry> local_1b0;
  string local_130 [3];
  long local_c8;
  string local_c0 [32];
  string local_a0 [36];
  int local_7c;
  char *local_78;
  ParamNameGeneratorFunc *local_70;
  undefined1 local_58 [16];
  pointer local_48;
  InstantiationInfo *local_40;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>_>
  local_38 [3];
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo> *local_20;
  __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>_>
  local_18;
  byte local_9;
  
  local_9 = 0;
  local_18._M_current =
       (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo> *)
       std::
       vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>
       ::begin((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>
                *)in_stack_fffffffffffffbe8);
  while( true ) {
    local_20 = (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>
                *)std::
                  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>
                  ::end((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>
                         *)in_stack_fffffffffffffbe8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffbf0,
                       (__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffbe8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>_>
    ::operator*(&local_18);
    std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>::
    shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>
                *)in_stack_fffffffffffffbf0,
               (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>
                *)in_stack_fffffffffffffbe8);
    local_38[0]._M_current =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>
         ::begin((vector<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>
                  *)in_stack_fffffffffffffbe8);
    while( true ) {
      local_40 = (InstantiationInfo *)
                 std::
                 vector<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>
                 ::end((vector<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>
                        *)in_stack_fffffffffffffbe8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffbf0,
                         (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffbe8);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>_>
                 ::operator->(local_38);
      pIVar3 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      (*pIVar3->generator)(local_58);
      pIVar3 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_70 = pIVar3->name_func;
      pIVar3 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_78 = pIVar3->file;
      pIVar3 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_7c = pIVar3->line;
      std::__cxx11::string::string(local_a0);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::operator+(&in_stack_fffffffffffffc18->name,(char *)in_stack_fffffffffffffc10);
        std::__cxx11::string::operator=(local_a0,local_c0);
        std::__cxx11::string::~string(local_c0);
      }
      peVar5 = std::
               __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1875de);
      std::__cxx11::string::operator+=(local_a0,(string *)peVar5);
      local_c8 = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x187609);
      ParamGenerator<BloatyTestEntry>::begin
                ((ParamGenerator<BloatyTestEntry> *)in_stack_fffffffffffffbf8);
      while( true ) {
        ParamGenerator<BloatyTestEntry>::end
                  ((ParamGenerator<BloatyTestEntry> *)in_stack_fffffffffffffbf8);
        bVar1 = ParamIterator<BloatyTestEntry>::operator!=
                          ((ParamIterator<BloatyTestEntry> *)in_stack_fffffffffffffbf0,
                           (ParamIterator<BloatyTestEntry> *)in_stack_fffffffffffffbe8);
        ParamIterator<BloatyTestEntry>::~ParamIterator((ParamIterator<BloatyTestEntry> *)0x187664);
        line_num = (int)((ulong)in_stack_fffffffffffffc38 >> 0x20);
        line_00 = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
        if (!bVar1) break;
        local_9 = 1;
        Message::Message((Message *)in_stack_fffffffffffffc20);
        tear_down_tc = local_70;
        factory = ParamIterator<BloatyTestEntry>::operator*
                            ((ParamIterator<BloatyTestEntry> *)0x18770d);
        TestParamInfo<BloatyTestEntry>::TestParamInfo
                  (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                   (size_t)in_stack_fffffffffffffbf0);
        (*tear_down_tc)(local_130,&local_1b0);
        TestParamInfo<BloatyTestEntry>::~TestParamInfo((TestParamInfo<BloatyTestEntry> *)0x18775f);
        condition = IsValidParamName(&in_stack_fffffffffffffbf8->name);
        uVar2 = IsTrue((bool)condition);
        if (!(bool)uVar2) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                             in_stack_fffffffffffffc60,line_00);
          poVar6 = GTestLog::GetStream(&local_1b4);
          poVar6 = std::operator<<(poVar6,"Condition IsValidParamName(param_name) failed. ");
          in_stack_fffffffffffffcf0 = std::operator<<(poVar6,"Parameterized test name \'");
          in_stack_fffffffffffffce8 = std::operator<<(in_stack_fffffffffffffcf0,(string *)local_130)
          ;
          in_stack_fffffffffffffce0 =
               std::operator<<(in_stack_fffffffffffffce8,"\' is invalid, in ");
          in_stack_fffffffffffffcd8 = std::operator<<(in_stack_fffffffffffffce0,local_78);
          in_stack_fffffffffffffcd0 =
               (CodeLocation *)std::operator<<(in_stack_fffffffffffffcd8," line ");
          in_stack_fffffffffffffcc8 =
               (void *)std::ostream::operator<<(in_stack_fffffffffffffcd0,local_7c);
          std::ostream::operator<<(in_stack_fffffffffffffcc8,std::endl<char,std::char_traits<char>>)
          ;
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffbf0);
        }
        sVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc00,&in_stack_fffffffffffffbf8->name);
        bVar1 = IsTrue(sVar7 == 0);
        if (!bVar1) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                             in_stack_fffffffffffffc60,line_00);
          poVar6 = GTestLog::GetStream(&local_1b8);
          poVar6 = std::operator<<(poVar6,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar6 = std::operator<<(poVar6,"Duplicate parameterized test name \'");
          poVar6 = std::operator<<(poVar6,(string *)local_130);
          poVar6 = std::operator<<(poVar6,"\', in ");
          poVar6 = std::operator<<(poVar6,local_78);
          poVar6 = std::operator<<(poVar6," line ");
          this_00 = (void *)std::ostream::operator<<(poVar6,local_7c);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffbf0);
        }
        pVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        local_1c8 = (_Base_ptr)pVar8.first._M_node;
        in_stack_fffffffffffffc77 = pVar8.second;
        local_1c0 = in_stack_fffffffffffffc77;
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x187b29);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::
          __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x187b46);
          in_stack_fffffffffffffc68 =
               Message::operator<<((Message *)in_stack_fffffffffffffbf0,
                                   &in_stack_fffffffffffffbe8->file);
          Message::operator<<((Message *)in_stack_fffffffffffffbf0,
                              (char (*) [2])in_stack_fffffffffffffbe8);
        }
        Message::operator<<((Message *)in_stack_fffffffffffffbf0,&in_stack_fffffffffffffbe8->file);
        in_stack_fffffffffffffc60 = (char *)std::__cxx11::string::c_str();
        Message::GetString_abi_cxx11_((Message *)in_stack_fffffffffffffbf8);
        std::__cxx11::string::c_str();
        in_stack_fffffffffffffc58 =
             ParamIterator<BloatyTestEntry>::operator*((ParamIterator<BloatyTestEntry> *)0x187bdb);
        PrintToString<BloatyTestEntry>(in_stack_fffffffffffffd98);
        std::__cxx11::string::c_str();
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x187c15);
        CodeLocation::CodeLocation
                  ((CodeLocation *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
        filename = (char *)(**(code **)(*in_RDI + 0x18))();
        in_stack_fffffffffffffbe8 =
             (CodeLocation *)
             SuiteApiResolver<BloatyOutputTest>::GetSetUpCaseOrSuite(filename,line_num);
        in_stack_fffffffffffffbf0 =
             (BloatyTestEntry *)
             SuiteApiResolver<BloatyOutputTest>::GetTearDownCaseOrSuite
                       (filename,(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x187c86);
        in_stack_fffffffffffffc20 =
             (BloatyTestEntry *)
             std::
             unique_ptr<testing::internal::TestMetaFactoryBase<BloatyTestEntry>,_std::default_delete<testing::internal::TestMetaFactoryBase<BloatyTestEntry>_>_>
             ::operator->((unique_ptr<testing::internal::TestMetaFactoryBase<BloatyTestEntry>,_std::default_delete<testing::internal::TestMetaFactoryBase<BloatyTestEntry>_>_>
                           *)0x187c92);
        ParamIterator<BloatyTestEntry>::operator*((ParamIterator<BloatyTestEntry> *)0x187ca4);
        BloatyTestEntry::BloatyTestEntry(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        in_stack_fffffffffffffbf8 =
             (BloatyTestEntry *)
             (**(code **)((long)*(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                  *)&in_stack_fffffffffffffc20->name + 0x10))
                       (in_stack_fffffffffffffc20,local_2a8);
        in_stack_fffffffffffffc18 = in_stack_fffffffffffffbf8;
        in_stack_fffffffffffffc38 = in_stack_fffffffffffffbe8;
        MakeAndRegisterTestInfo
                  ((char *)in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                   (char *)in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8,
                   in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                   (SetUpTestSuiteFunc)CONCAT17(condition,CONCAT16(uVar2,in_stack_fffffffffffffd00))
                   ,(TearDownTestSuiteFunc)tear_down_tc,(TestFactoryBase *)factory);
        BloatyTestEntry::~BloatyTestEntry(in_stack_fffffffffffffbf0);
        CodeLocation::~CodeLocation((CodeLocation *)0x187d3a);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string(local_1e8);
        std::__cxx11::string::~string((string *)local_130);
        Message::~Message((Message *)0x187d6e);
        ParamIterator<BloatyTestEntry>::operator++
                  ((ParamIterator<BloatyTestEntry> *)in_stack_fffffffffffffbf0);
        local_c8 = local_c8 + 1;
      }
      ParamIterator<BloatyTestEntry>::~ParamIterator((ParamIterator<BloatyTestEntry> *)0x18767c);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x187e56);
      std::__cxx11::string::~string(local_a0);
      ParamGenerator<BloatyTestEntry>::~ParamGenerator((ParamGenerator<BloatyTestEntry> *)0x187e70);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>_>
      ::operator++(local_38);
    }
    std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>::
    ~shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>
                 *)0x187eb8);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>_>
    ::operator++(&local_18);
  }
  if ((local_9 & 1) == 0) {
    (**(code **)(*in_RDI + 0x10))();
    CodeLocation::CodeLocation((CodeLocation *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    std::
    vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>
    ::empty((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>
             *)in_stack_fffffffffffffc00);
    InsertSyntheticTestCase(in_stack_00000060,in_stack_00000058,in_stack_00000057);
    CodeLocation::~CodeLocation((CodeLocation *)0x187f52);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin(); gen_it != instantiations_.end();
               ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if ( !instantiation_name.empty() )
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name = name_func(
              TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file
              << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name
              << "', in " << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }  // for gen_it
    }  // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }